

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingExtension
          (MergedDescriptorDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  value_type pDVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppDVar5;
  string *psVar6;
  int local_114;
  undefined1 local_110 [4];
  int j;
  FileDescriptorProto temp;
  int i;
  FileDescriptorProto *output_local;
  int field_number_local;
  string *containing_type_local;
  MergedDescriptorDatabase *this_local;
  
  temp.source_code_info_._4_4_ = 0;
  while( true ) {
    uVar3 = (ulong)temp.source_code_info_._4_4_;
    sVar4 = std::
            vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ::size(&this->sources_);
    if (sVar4 <= uVar3) {
      return false;
    }
    ppDVar5 = std::
              vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ::operator[](&this->sources_,(long)temp.source_code_info_._4_4_);
    uVar2 = (*(*ppDVar5)->_vptr_DescriptorDatabase[4])
                      (*ppDVar5,containing_type,(ulong)(uint)field_number,output);
    if ((uVar2 & 1) != 0) break;
    temp.source_code_info_._4_4_ = temp.source_code_info_._4_4_ + 1;
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_110);
  local_114 = 0;
  do {
    if (temp.source_code_info_._4_4_ <= local_114) {
      this_local._7_1_ = true;
LAB_00546979:
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_110);
      return this_local._7_1_;
    }
    ppDVar5 = std::
              vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ::operator[](&this->sources_,(long)local_114);
    pDVar1 = *ppDVar5;
    psVar6 = FileDescriptorProto::name_abi_cxx11_(output);
    uVar2 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,psVar6,local_110);
    if ((uVar2 & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_00546979;
    }
    local_114 = local_114 + 1;
  } while( true );
}

Assistant:

bool MergedDescriptorDatabase::FindFileContainingExtension(
    const string& containing_type,
    int field_number,
    FileDescriptorProto* output) {
  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileContainingExtension(
          containing_type, field_number, output)) {
      // The symbol was found in source i.  However, if one of the previous
      // sources defines a file with the same name (which presumably doesn't
      // contain the symbol, since it wasn't found in that source), then we
      // must hide it from the caller.
      FileDescriptorProto temp;
      for (int j = 0; j < i; j++) {
        if (sources_[j]->FindFileByName(output->name(), &temp)) {
          // Found conflicting file in a previous source.
          return false;
        }
      }
      return true;
    }
  }
  return false;
}